

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

void __thiscall Jupiter::Config::Config(Config *this,Config *in_config)

{
  Config *in_config_local;
  Config *this_local;
  
  this->_vptr_Config = (_func_int **)&PTR_read_internal_001ea0e8;
  std::__cxx11::string::string((string *)&this->m_name);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->m_table);
  std::
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  ::operator*(&in_config->m_sections);
  std::
  make_unique<std::unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>,std::unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>&>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
              *)&this->m_sections);
  return;
}

Assistant:

Jupiter::Config::Config(const Config& in_config)
	: m_sections{ std::make_unique<SectionHashTable>(*in_config.m_sections) } {
}